

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::ReadBRUS(B3DImporter *this)

{
  pointer pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  __uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true> this_00;
  B3DImporter *pBVar5;
  size_t sVar6;
  float fVar7;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  float specpow;
  float alpha;
  aiColor3D speccolor;
  aiVector3D local_8a8;
  string name;
  undefined1 local_878 [64];
  int i;
  undefined1 local_834 [1024];
  aiString ainame;
  
  uVar2 = ReadInt(this);
  if (8 < uVar2) {
    pBVar5 = (B3DImporter *)(local_878 + 0x20);
    std::__cxx11::string::string((string *)pBVar5,"Bad texture count",(allocator *)&ainame);
    Fail(pBVar5,(string *)(local_878 + 0x20));
  }
  do {
    if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] == this->_pos) {
      return;
    }
    ReadString_abi_cxx11_(&name,this);
    local_8a8 = ReadVec3(this);
    alpha = ReadFloat(this);
    fVar7 = ReadFloat(this);
    ReadInt(this);
    uVar3 = ReadInt(this);
    this_00.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
    super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
    super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
         (__uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>)operator_new(0x10);
    aiMaterial::aiMaterial
              ((aiMaterial *)
               this_00.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl);
    sVar6 = name._M_string_length & 0xffffffff;
    if ((name._M_string_length & 0xfffffc00) != 0) {
      sVar6 = 0x3ff;
    }
    ainame.length = (ai_uint32)sVar6;
    mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
    super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
    super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
         (__uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true>)
         (__uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true>)
         this_00.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
         super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
         super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl;
    memcpy(ainame.data,name._M_dataplus._M_p,sVar6);
    ainame.data[sVar6] = '\0';
    aiMaterial::AddProperty
              ((aiMaterial *)
               this_00.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&ainame,"?mat.name",0,0);
    aiMaterial::AddProperty
              ((aiMaterial *)
               mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&local_8a8,1,"$clr.diffuse",0
               ,0);
    aiMaterial::AddProperty
              ((aiMaterial *)
               mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&alpha,1,"$mat.opacity",0,0);
    speccolor.r = fVar7;
    speccolor.g = fVar7;
    speccolor.b = fVar7;
    aiMaterial::AddProperty
              ((aiMaterial *)
               mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&speccolor,1,"$clr.specular",
               0,0);
    specpow = fVar7 * 128.0;
    aiMaterial::AddProperty
              ((aiMaterial *)
               mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&specpow,1,"$mat.shininess",0
               ,0);
    if ((uVar3 & 0x10) != 0) {
      i = 1;
      aiMaterial::AddProperty
                ((aiMaterial *)
                 mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
                 super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                 super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&i,1,"$mat.twosided",0,0);
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar4 = ReadInt(this);
      if ((int)uVar4 < -1) {
LAB_003daba7:
        pBVar5 = (B3DImporter *)local_878;
        std::__cxx11::string::string((string *)pBVar5,"Bad texture id",(allocator *)&i);
        Fail(pBVar5,(string *)local_878);
      }
      if (-1 < (int)uVar4) {
        pbVar1 = (this->_textures).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(this->_textures).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5) <=
            (int)uVar4) goto LAB_003daba7;
        if (uVar3 == 0) {
          sVar6 = pbVar1[uVar4]._M_string_length & 0xffffffff;
          if ((pbVar1[uVar4]._M_string_length & 0xfffffc00) != 0) {
            sVar6 = 0x3ff;
          }
          i = (int)sVar6;
          memcpy(local_834,pbVar1[uVar4]._M_dataplus._M_p,sVar6);
          local_834[sVar6] = 0;
          aiMaterial::AddProperty
                    ((aiMaterial *)
                     mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>.
                     _M_t.super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                     super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,(aiString *)&i,
                     "$tex.file",1,0);
        }
      }
    }
    std::
    vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
    ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
              ((vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
                *)&this->_materials,&mat);
    std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr(&mat);
    std::__cxx11::string::~string((string *)&name);
  } while( true );
}

Assistant:

void B3DImporter::ReadBRUS(){
    int n_texs=ReadInt();
    if( n_texs<0 || n_texs>8 ){
        Fail( "Bad texture count" );
    }
    while( ChunkSize() ){
        string name=ReadString();
        aiVector3D color=ReadVec3();
        float alpha=ReadFloat();
        float shiny=ReadFloat();
        /*int blend=**/ReadInt();
        int fx=ReadInt();

        std::unique_ptr<aiMaterial> mat(new aiMaterial);

        // Name
        aiString ainame( name );
        mat->AddProperty( &ainame,AI_MATKEY_NAME );

        // Diffuse color
        mat->AddProperty( &color,1,AI_MATKEY_COLOR_DIFFUSE );

        // Opacity
        mat->AddProperty( &alpha,1,AI_MATKEY_OPACITY );

        // Specular color
        aiColor3D speccolor( shiny,shiny,shiny );
        mat->AddProperty( &speccolor,1,AI_MATKEY_COLOR_SPECULAR );

        // Specular power
        float specpow=shiny*128;
        mat->AddProperty( &specpow,1,AI_MATKEY_SHININESS );

        // Double sided
        if( fx & 0x10 ){
            int i=1;
            mat->AddProperty( &i,1,AI_MATKEY_TWOSIDED );
        }

        //Textures
        for( int i=0;i<n_texs;++i ){
            int texid=ReadInt();
            if( texid<-1 || (texid>=0 && texid>=static_cast<int>(_textures.size())) ){
                Fail( "Bad texture id" );
            }
            if( i==0 && texid>=0 ){
                aiString texname( _textures[texid] );
                mat->AddProperty( &texname,AI_MATKEY_TEXTURE_DIFFUSE(0) );
            }
        }
        _materials.emplace_back( std::move(mat) );
    }
}